

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O2

void __thiscall
Omega_h::MetricEdgeLengths<2,_2>::MetricEdgeLengths
          (MetricEdgeLengths<2,_2> *this,Mesh *mesh,Reals *metrics_in)

{
  Omega_h::Mesh::coords((Mesh *)this);
  Write<double>::Write(&(this->metrics).write_,&metrics_in->write_);
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}